

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage3RunnerNonRecursive.hpp
# Opt level: O0

void Centaurus::Stage3Runner::append_value<unsigned_long_const*>
               (unsigned_long **values_next_it,int n,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *values,
               vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
               *tags)

{
  bool bVar1;
  value_type vVar2;
  reference pvVar3;
  long lVar4;
  reference pvVar5;
  StackEntryTag local_2c;
  vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  *local_28;
  vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  *tags_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *values_local;
  unsigned_long **ppuStack_10;
  int n_local;
  unsigned_long **values_next_it_local;
  
  local_28 = tags;
  tags_local = (vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                *)values;
  values_local._4_4_ = n;
  ppuStack_10 = values_next_it;
  pvVar3 = std::
           vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
           ::back(tags);
  bVar1 = detail::isValueTag(*pvVar3);
  if (bVar1) {
    pvVar3 = std::
             vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
             ::back(local_28);
    vVar2 = *pvVar3 + values_local._4_4_;
    pvVar3 = std::
             vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
             ::back(local_28);
    *pvVar3 = vVar2;
  }
  else {
    local_2c = values_local._4_4_;
    std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
    ::emplace_back<Centaurus::detail::StackEntryTag>(local_28,&local_2c);
  }
  lVar4 = (long)values_local._4_4_;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::front
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)tags_local);
  *pvVar5 = lVar4 + *pvVar5;
  return;
}

Assistant:

static void append_value(Iterator& values_next_it, int n, std::vector<semantic_value_type>& values, std::vector<detail::StackEntryTag>& tags)
  {
    if (detail::isValueTag(tags.back())) {
      tags.back() = static_cast<detail::StackEntryTag>(static_cast<int>(tags.back()) + n);
    } else {
      tags.emplace_back(static_cast<detail::StackEntryTag>(n));
    }
#if PYCENTAURUS
    values.front() += n;
#else
    for (int i = 0; i < n; i++) {
      values.emplace_back(*values_next_it++);
    }
#endif
  }